

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_10610f::ToString::visit(ToString *this,FieldBegin fb)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_8;
  
  uStack_8 = in_RAX;
  poVar1 = (ostream *)std::ostream::write(&this->field_0x10,(long)fb.name._ptr);
  uStack_8 = CONCAT17(0x28,(undefined7)uStack_8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_8 + 7),1);
  poVar1 = (ostream *)std::ostream::write((char *)poVar1,(long)fb.tag._ptr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"): ",3);
  return;
}

Assistant:

void visit(mserialize::Visitor::FieldBegin fb)    { _str << fb.name << '(' << fb.tag << "): "; }